

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Channel.cpp
# Opt level: O0

void __thiscall sznet::net::Channel::Channel(Channel *this,EventLoop *loop,sz_fd fd)

{
  sz_fd fd_local;
  EventLoop *loop_local;
  Channel *this_local;
  
  this->m_loop = loop;
  this->m_fd = fd;
  this->m_events = 0;
  this->m_revents = 0;
  this->m_index = -1;
  this->m_logHup = true;
  std::weak_ptr<void>::weak_ptr(&this->m_tie);
  this->m_tied = false;
  this->m_eventHandling = false;
  this->m_addedToLoop = false;
  std::function<void_(sznet::Timestamp)>::function(&this->m_readCallback);
  std::function<void_()>::function(&this->m_writeCallback);
  std::function<void_()>::function(&this->m_closeCallback);
  std::function<void_()>::function(&this->m_errorCallback);
  return;
}

Assistant:

Channel::Channel(EventLoop* loop, sockets::sz_fd fd):
	m_loop(loop),
	m_fd(fd),
	m_events(0),
	m_revents(0),
	m_index(-1),
	m_logHup(true),
	m_tied(false),
	m_eventHandling(false),
	m_addedToLoop(false)
{
}